

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O3

int compare(string *directory1,string *basename1,string *directory2,string *basename2,
           Bounds *iBounds,Bounds *jBounds,Bounds *kBounds,Bounds *lBounds,double tolerance,
           bool infoOnly,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *specificFields)

{
  string *psVar1;
  pointer pbVar2;
  pointer pbVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  DataFieldInfo *pDVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  string *fieldname;
  char cVar15;
  byte bVar16;
  IJKLBounds bounds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fieldsAtSavepoint;
  DataFieldInfo info1;
  DataFieldInfo info2;
  Serializer serializer1;
  Serializer serializer2;
  uint local_414;
  vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  double local_3e0;
  undefined8 local_3d8;
  IJKLBounds local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  vector<bool,_std::allocator<bool>_> local_398;
  ulong local_370;
  Bounds *local_368;
  Bounds *local_360;
  DataFieldInfo local_358;
  DataFieldInfo local_2a8;
  Serializer local_200;
  Serializer local_118;
  
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_200._vptr_Serializer = (_func_int **)&PTR__Serializer_00137bb8;
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_200.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_200.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200.pFileFormat_.px = (element_type *)0x0;
  local_200.pFileFormat_.pn.pi_ = (sp_counted_base *)0x0;
  local_3e0 = tolerance;
  local_368 = iBounds;
  local_360 = jBounds;
  local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_200.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_200.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_200.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ser::Serializer::Init(&local_200,directory1,basename1,SerializerOpenModeRead);
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118._vptr_Serializer = (_func_int **)&PTR__Serializer_00137bb8;
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.pFileFormat_.px = (element_type *)0x0;
  local_118.pFileFormat_.pn.pi_ = (sp_counted_base *)0x0;
  local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ser::Serializer::Init(&local_118,directory2,basename2,SerializerOpenModeRead);
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::vector
            (&local_410,&local_200.offsetTable_.savepoints_);
  if (local_410.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_410.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_414 = 0;
  }
  else {
    iVar14 = 0;
    uVar12 = 0;
    local_3d8 = 0;
    do {
      local_370 = uVar12;
      std::__cxx11::string::substr
                ((ulong)&local_358,
                 (ulong)(local_410.
                         super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar12));
      iVar6 = std::__cxx11::string::compare((char *)&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.name_._M_dataplus._M_p != &local_358.name_.field_2) {
        operator_delete(local_358.name_._M_dataplus._M_p);
      }
      if (iVar6 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"---------------------------------",0x21);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            local_410.
                            super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar12].name_._M_dataplus._M_p,
                            local_410.
                            super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar12].name_._M_string_length)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        ser::MetainfoSet::ToString_abi_cxx11_
                  (&local_358.name_,
                   &local_410.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar12].metainfo_);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_358.name_._M_dataplus._M_p,
                            local_358.name_._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358.name_._M_dataplus._M_p != &local_358.name_.field_2) {
          operator_delete(local_358.name_._M_dataplus._M_p);
        }
        ser::Serializer::FieldsAtSavepoint_abi_cxx11_
                  (&local_3b0,&local_200,
                   local_410.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar12);
        local_3f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_3f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_3f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pbVar2 = (specificFields->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (specificFields->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar2 == pbVar3) {
          ser::Serializer::FieldsAtSavepoint_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2a8,&local_200,
                     local_410.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar12);
          local_358.name_.field_2._M_allocated_capacity =
               (size_type)
               local_3f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_358.name_._M_string_length =
               (size_type)
               local_3f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_358.name_._M_dataplus._M_p =
               (pointer)local_3f8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_3f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_2a8.name_.field_2._M_allocated_capacity;
          local_3f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2a8.name_._M_dataplus._M_p;
          local_3f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2a8.name_._M_string_length;
          local_2a8.name_._M_dataplus._M_p = (pointer)0x0;
          local_2a8.name_._M_string_length = 0;
          local_2a8.name_.field_2._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_358);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2a8);
          fieldname = local_3f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          psVar4 = local_3f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          uVar8 = (long)pbVar3 - (long)pbVar2 >> 5;
          uVar13 = (long)local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar8 <= uVar13) {
            uVar13 = uVar8;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_3f8,uVar13);
          _Var9 = std::
                  __set_intersection<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (local_3b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_3b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (specificFields->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (specificFields->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,
                             local_3f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_3f8,
                   (long)_Var9._M_current -
                   (long)local_3f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
          fieldname = local_3f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          psVar4 = local_3f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; fieldname != psVar4; fieldname = fieldname + 1) {
          local_358.name_._M_dataplus._M_p._0_1_ = 9;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_358,1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(fieldname->_M_dataplus)._M_p,fieldname->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pDVar10 = ser::Serializer::FindField(&local_200,fieldname);
          ser::DataFieldInfo::DataFieldInfo(&local_358,pDVar10);
          pDVar10 = ser::Serializer::FindField(&local_118,fieldname);
          ser::DataFieldInfo::DataFieldInfo(&local_2a8,pDVar10);
          local_3d0.iLower = local_368->lower;
          if (local_368->lower < 1) {
            local_3d0.iLower = iVar14;
          }
          local_3d0.iUpper = local_358.iSize_ + -1;
          if (local_368->upper < local_358.iSize_ + -1) {
            local_3d0.iUpper = local_368->upper;
          }
          local_3d0.jLower = local_360->lower;
          if (local_360->lower < 1) {
            local_3d0.jLower = iVar14;
          }
          local_3d0.jUpper = local_358.jSize_ + -1;
          if (local_360->upper < local_358.jSize_ + -1) {
            local_3d0.jUpper = local_360->upper;
          }
          local_3d0.kLower = kBounds->lower;
          if (kBounds->lower < 1) {
            local_3d0.kLower = iVar14;
          }
          local_3d0.kUpper = local_358.kSize_ + -1;
          if (kBounds->upper < local_358.kSize_ + -1) {
            local_3d0.kUpper = kBounds->upper;
          }
          local_3d0.lLower = lBounds->lower;
          if (lBounds->lower < 1) {
            local_3d0.lLower = iVar14;
          }
          local_3d0.lUpper = local_358.lSize_ + -1;
          if (lBounds->upper < local_358.lSize_ + -1) {
            local_3d0.lUpper = lBounds->upper;
          }
          bVar5 = compareInfo(&local_358,&local_2a8);
          uVar11 = 1;
          if (bVar5) {
            uVar11 = local_414;
          }
          psVar1 = &local_358.type_;
          if (bVar5 && !infoOnly) {
            local_398.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_398.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_398.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_398.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            local_398.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
            iVar6 = std::__cxx11::string::compare((char *)psVar1);
            if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 == 0))
            {
              bVar5 = compareData<int>(&local_200,&local_118,
                                       local_410.
                                       super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar12,&local_358
                                       ,&local_2a8,&local_3d0,local_3e0,&local_398);
              if (bVar5) {
LAB_00115370:
                bVar16 = 0;
              }
              else {
                bVar16 = 1;
                printDifference<int>
                          (&local_200,&local_118,
                           local_410.
                           super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar12,&local_358,&local_2a8,
                           &local_3d0,&local_398);
              }
LAB_001153b1:
              local_3d8 = CONCAT71((int7)((ulong)local_3d8 >> 8),(byte)local_3d8 | bVar16);
              cVar15 = '\0';
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar6 == 0) {
                bVar5 = compareData<double>(&local_200,&local_118,
                                            local_410.
                                            super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                            &local_358,&local_2a8,&local_3d0,local_3e0,&local_398);
                if (bVar5) goto LAB_00115370;
                bVar16 = 1;
                printDifference<double>
                          (&local_200,&local_118,
                           local_410.
                           super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar12,&local_358,&local_2a8,
                           &local_3d0,&local_398);
                goto LAB_001153b1;
              }
              iVar6 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar6 == 0) {
                bVar5 = compareData<float>(&local_200,&local_118,
                                           local_410.
                                           super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                           &local_358,&local_2a8,&local_3d0,local_3e0,&local_398);
                if (bVar5) goto LAB_00115370;
                bVar16 = 1;
                printDifference<float>
                          (&local_200,&local_118,
                           local_410.
                           super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar12,&local_358,&local_2a8,
                           &local_3d0,&local_398);
                goto LAB_001153b1;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unsupported type: ",0x12);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_358.type_._M_dataplus._M_p,
                                  local_358.type_._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              local_414 = 2;
              cVar15 = '\x01';
            }
            if (local_398.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_398.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            }
          }
          else {
            cVar15 = bVar5 * '\x05' + '\x01';
            local_414 = uVar11;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                       *)&local_2a8.metainfo_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8.type_._M_dataplus._M_p != &local_2a8.type_.field_2) {
            operator_delete(local_2a8.type_._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8.name_._M_dataplus._M_p != &local_2a8.name_.field_2) {
            operator_delete(local_2a8.name_._M_dataplus._M_p);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                       *)&local_358.metainfo_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358.type_._M_dataplus._M_p != &local_358.type_.field_2) {
            operator_delete(local_358.type_._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358.name_._M_dataplus._M_p != &local_358.name_.field_2) {
            operator_delete(local_358.name_._M_dataplus._M_p);
          }
          if ((cVar15 != '\x06') && (cVar15 != '\0')) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3b0);
            goto LAB_001155f4;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3b0);
      }
      uVar12 = local_370 + 1;
      uVar13 = ((long)local_410.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_410.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
    } while (uVar12 <= uVar13 && uVar13 - uVar12 != 0);
    local_414 = (uint)((byte)local_3d8 & 1);
  }
LAB_001155f4:
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::~vector(&local_410);
  ser::Serializer::~Serializer(&local_118);
  ser::Serializer::~Serializer(&local_200);
  return local_414;
}

Assistant:

int compare(const std::string& directory1, const std::string& basename1,
            const std::string& directory2, const std::string& basename2,
            const Bounds& iBounds, const Bounds& jBounds,
            const Bounds& kBounds, const Bounds& lBounds,
            double tolerance, bool infoOnly, const vector<string>& specificFields)

{
    Serializer serializer1;
    serializer1.Init(directory1, basename1, SerializerOpenModeRead);

    Serializer serializer2;
    serializer2.Init(directory2, basename2, SerializerOpenModeRead);

    vector<Savepoint> savepoints = serializer1.savepoints();

    bool hasDifferences = false;

    for (int i = 0; i < savepoints.size(); i++)
    {
        if (savepoints[i].name().substr(savepoints[i].name().size() - 4, 4) != "-out")
            continue;

        std::cout << "---------------------------------" << std::endl;
        std::cout << savepoints[i].name()                << std::endl;
        std::cout << savepoints[i].metainfo().ToString() << std::endl;

        vector<string> fieldsAtSavepoint = serializer1.FieldsAtSavepoint(savepoints[i]);
        vector<string> fields;

        if (specificFields.empty()) {

            fields = serializer1.FieldsAtSavepoint(savepoints[i]);
        } else {
            fields.resize(std::min(specificFields.size(), fieldsAtSavepoint.size()));
            auto it = std::set_intersection(fieldsAtSavepoint.begin(), fieldsAtSavepoint.end(),
                specificFields.begin(), specificFields.end(), fields.begin());
            fields.resize(it - fields.begin());
        }

        for (auto const& field : fields) {
            std::cout << '\t' << field << std::endl;

            DataFieldInfo info1 = serializer1.FindField(field);
            DataFieldInfo info2 = serializer2.FindField(field);

            IJKLBounds bounds = getIJKLBounds(info1, iBounds, jBounds, kBounds, lBounds);

            bool equal = compareInfo(info1, info2);
            if (!equal) {
                return 1;
            } else if (infoOnly) {
                continue;
            }

            vector<bool> failed;

            if (info1.type() == "integer" || info1.type() == "int") {
                equal = compareData<int>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<int>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else if (info1.type() == "double") {
                equal = compareData<double>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<double>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else if (info1.type() == "float") {
                equal = compareData<float>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<float>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else {
                std::cerr << "Unsupported type: " << info1.type() << std::endl;
                return 2;
            }
            hasDifferences = hasDifferences | !equal;
        }
    }

    if (hasDifferences) {
        return 1;
    }
    return 0;
}